

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathNormalizeFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  byte *pbVar1;
  bool bVar2;
  xmlChar *val;
  xmlXPathObjectPtr pxVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte bVar6;
  ulong uVar7;
  int iStack_20;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 1) {
    if (nargs != 0) {
      iStack_20 = 0xc;
      goto LAB_001b40a8;
    }
    val = xmlNodeGetContent(ctxt->context->node);
    if (val == (xmlChar *)0x0) {
      xmlXPathPErrMemory(ctxt);
    }
    pxVar3 = xmlXPathCacheWrapString(ctxt,val);
    xmlXPathValuePush(ctxt,pxVar3);
  }
  if (ctxt->valueNr < 1) {
    iStack_20 = 0x17;
  }
  else {
    pxVar3 = ctxt->value;
    if (pxVar3 != (xmlXPathObjectPtr)0x0) {
      if (pxVar3->type == XPATH_STRING) {
LAB_001b406b:
        pbVar4 = pxVar3->stringval;
        pbVar1 = pbVar4;
        if (pbVar4 == (byte *)0x0) {
          return;
        }
        do {
          pbVar5 = pbVar1 + 1;
          uVar7 = (ulong)*pbVar1;
          if (0x20 < uVar7) break;
          pbVar1 = pbVar5;
        } while ((0x100002600U >> (uVar7 & 0x3f) & 1) != 0);
        bVar2 = false;
        do {
          bVar6 = (byte)uVar7;
          if (bVar6 < 0x21) {
            if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) {
              if (uVar7 == 0) {
                *pbVar4 = 0;
                return;
              }
              goto LAB_001b40db;
            }
            bVar2 = true;
          }
          else {
LAB_001b40db:
            if (bVar2) {
              *pbVar4 = 0x20;
              pbVar4 = pbVar4 + 1;
              bVar6 = pbVar5[-1];
            }
            *pbVar4 = bVar6;
            pbVar4 = pbVar4 + 1;
            bVar2 = false;
          }
          uVar7 = (ulong)*pbVar5;
          pbVar5 = pbVar5 + 1;
        } while( true );
      }
      xmlXPathStringFunction(ctxt,1);
      pxVar3 = ctxt->value;
      if ((pxVar3 != (xmlXPathObjectPtr)0x0) && (pxVar3->type == XPATH_STRING)) goto LAB_001b406b;
    }
    iStack_20 = 0xb;
  }
LAB_001b40a8:
  xmlXPathErr(ctxt,iStack_20);
  return;
}

Assistant:

void
xmlXPathNormalizeFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlChar *source, *target;
    int blank;

    if (ctxt == NULL) return;
    if (nargs == 0) {
        /* Use current context node */
        source = xmlXPathCastNodeToString(ctxt->context->node);
        if (source == NULL)
            xmlXPathPErrMemory(ctxt);
        xmlXPathValuePush(ctxt, xmlXPathCacheWrapString(ctxt, source));
        nargs = 1;
    }

    CHECK_ARITY(1);
    CAST_TO_STRING;
    CHECK_TYPE(XPATH_STRING);
    source = ctxt->value->stringval;
    if (source == NULL)
        return;
    target = source;

    /* Skip leading whitespaces */
    while (IS_BLANK_CH(*source))
        source++;

    /* Collapse intermediate whitespaces, and skip trailing whitespaces */
    blank = 0;
    while (*source) {
        if (IS_BLANK_CH(*source)) {
	    blank = 1;
        } else {
            if (blank) {
                *target++ = 0x20;
                blank = 0;
            }
            *target++ = *source;
        }
        source++;
    }
    *target = 0;
}